

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationIterator::nextCE32FromDiscontiguousContraction
          (CollationIterator *this,CollationData *d,UCharsTrie *suffixes,uint32_t ce32,
          int32_t lookAhead,UChar32 c,UErrorCode *errorCode)

{
  UBool UVar1;
  uint16_t uVar2;
  uint uVar3;
  int iVar4;
  UStringTrieResult UVar5;
  SkippedState *this_00;
  size_t size;
  SkippedState *local_80;
  int iStack_64;
  UBool isTopDiscontiguous;
  UStringTrieResult match;
  int32_t sinceMatch;
  int32_t i;
  byte local_3d;
  uint16_t uStack_36;
  uint8_t prevCC;
  UChar32 nextCp;
  uint16_t fcd16;
  UChar32 c_local;
  int32_t lookAhead_local;
  uint32_t ce32_local;
  UCharsTrie *suffixes_local;
  CollationData *d_local;
  CollationIterator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    uVar2 = CollationData::getFCD16(d,c);
    nextCp = nextSkippedCodePoint(this,errorCode);
    this_local._4_4_ = ce32;
    if (nextCp < 0) {
      backwardNumSkipped(this,1,errorCode);
    }
    else {
      uVar3 = lookAhead + 1;
      local_3d = (byte)uVar2;
      size = (size_t)(uint)nextCp;
      uStack_36 = CollationData::getFCD16(d,nextCp);
      if (uStack_36 < 0x100) {
        backwardNumSkipped(this,2,errorCode);
      }
      else {
        if ((this->skipped == (SkippedState *)0x0) ||
           (UVar1 = SkippedState::isEmpty(this->skipped), UVar1 != '\0')) {
          if (this->skipped == (SkippedState *)0x0) {
            this_00 = (SkippedState *)UMemory::operator_new((UMemory *)0xa8,size);
            local_80 = (SkippedState *)0x0;
            if (this_00 != (SkippedState *)0x0) {
              SkippedState::SkippedState(this_00);
              local_80 = this_00;
            }
            this->skipped = local_80;
            if (this->skipped == (SkippedState *)0x0) {
              *errorCode = U_MEMORY_ALLOCATION_ERROR;
              return 0;
            }
          }
          UCharsTrie::reset(suffixes);
          if (2 < (int)uVar3) {
            (*(this->super_UObject)._vptr_UObject[0xd])(this,(ulong)uVar3,errorCode);
            iVar4 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
            UCharsTrie::firstForCodePoint(suffixes,iVar4);
            for (match = USTRINGTRIE_INTERMEDIATE_VALUE; (int)match < (int)uVar3;
                match = match + USTRINGTRIE_NO_VALUE) {
              iVar4 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
              UCharsTrie::nextForCodePoint(suffixes,iVar4);
            }
            (*(this->super_UObject)._vptr_UObject[0xc])(this,2,errorCode);
          }
          SkippedState::saveTrieState(this->skipped,suffixes);
        }
        else {
          SkippedState::resetToTrieState(this->skipped,suffixes);
        }
        SkippedState::setFirstSkipped(this->skipped,c);
        iStack_64 = 2;
        c_local = ce32;
        do {
          if (((uint)local_3d < (uint)((int)(uint)uStack_36 >> 8)) &&
             (UVar5 = UCharsTrie::nextForCodePoint(suffixes,nextCp), 1 < (int)UVar5)) {
            c_local = UCharsTrie::getValue(suffixes);
            iStack_64 = 0;
            SkippedState::recordMatch(this->skipped);
            if ((UVar5 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) break;
            SkippedState::saveTrieState(this->skipped,suffixes);
          }
          else {
            SkippedState::skip(this->skipped,nextCp);
            SkippedState::resetToTrieState(this->skipped,suffixes);
            local_3d = (byte)uStack_36;
          }
          nextCp = nextSkippedCodePoint(this,errorCode);
          if (nextCp < 0) break;
          iStack_64 = iStack_64 + 1;
          uStack_36 = CollationData::getFCD16(d,nextCp);
        } while (0xff < uStack_36);
        backwardNumSkipped(this,iStack_64,errorCode);
        UVar1 = SkippedState::isEmpty(this->skipped);
        SkippedState::replaceMatch(this->skipped);
        if ((UVar1 != '\0') && (UVar1 = SkippedState::isEmpty(this->skipped), UVar1 == '\0')) {
          nextCp = -1;
          suffixes_local = (UCharsTrie *)d;
          while( true ) {
            appendCEsFromCE32(this,(CollationData *)suffixes_local,nextCp,c_local,'\x01',errorCode);
            UVar1 = SkippedState::hasNext(this->skipped);
            if (UVar1 == '\0') break;
            nextCp = SkippedState::next(this->skipped);
            c_local = (*(this->super_UObject)._vptr_UObject[0xe])(this,(ulong)(uint)nextCp);
            if (c_local == 0xc0) {
              suffixes_local = (UCharsTrie *)this->data->base;
              c_local = CollationData::getCE32((CollationData *)suffixes_local,nextCp);
            }
            else {
              suffixes_local = (UCharsTrie *)this->data;
            }
          }
          SkippedState::clear(this->skipped);
          c_local = 1;
        }
        this_local._4_4_ = c_local;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationIterator::nextCE32FromDiscontiguousContraction(
        const CollationData *d, UCharsTrie &suffixes, uint32_t ce32,
        int32_t lookAhead, UChar32 c,
        UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }

    // UCA section 3.3.2 Contractions:
    // Contractions that end with non-starter characters
    // are known as discontiguous contractions.
    // ... discontiguous contractions must be detected in input text
    // whenever the final sequence of non-starter characters could be rearranged
    // so as to make a contiguous matching sequence that is canonically equivalent.

    // UCA: http://www.unicode.org/reports/tr10/#S2.1
    // S2.1 Find the longest initial substring S at each point that has a match in the table.
    // S2.1.1 If there are any non-starters following S, process each non-starter C.
    // S2.1.2 If C is not blocked from S, find if S + C has a match in the table.
    //     Note: A non-starter in a string is called blocked
    //     if there is another non-starter of the same canonical combining class or zero
    //     between it and the last character of canonical combining class 0.
    // S2.1.3 If there is a match, replace S by S + C, and remove C.

    // First: Is a discontiguous contraction even possible?
    uint16_t fcd16 = d->getFCD16(c);
    U_ASSERT(fcd16 > 0xff);  // The caller checked this already, as a shortcut.
    UChar32 nextCp = nextSkippedCodePoint(errorCode);
    if(nextCp < 0) {
        // No further text.
        backwardNumSkipped(1, errorCode);
        return ce32;
    }
    ++lookAhead;
    uint8_t prevCC = (uint8_t)fcd16;
    fcd16 = d->getFCD16(nextCp);
    if(fcd16 <= 0xff) {
        // The next code point after c is a starter (S2.1.1 "process each non-starter").
        backwardNumSkipped(2, errorCode);
        return ce32;
    }

    // We have read and matched (lookAhead-2) code points,
    // read non-matching c and peeked ahead at nextCp.
    // Return to the state before the mismatch and continue matching with nextCp.
    if(skipped == NULL || skipped->isEmpty()) {
        if(skipped == NULL) {
            skipped = new SkippedState();
            if(skipped == NULL) {
                errorCode = U_MEMORY_ALLOCATION_ERROR;
                return 0;
            }
        }
        suffixes.reset();
        if(lookAhead > 2) {
            // Replay the partial match so far.
            backwardNumCodePoints(lookAhead, errorCode);
            suffixes.firstForCodePoint(nextCodePoint(errorCode));
            for(int32_t i = 3; i < lookAhead; ++i) {
                suffixes.nextForCodePoint(nextCodePoint(errorCode));
            }
            // Skip c (which did not match) and nextCp (which we will try now).
            forwardNumCodePoints(2, errorCode);
        }
        skipped->saveTrieState(suffixes);
    } else {
        // Reset to the trie state before the failed match of c.
        skipped->resetToTrieState(suffixes);
    }

    skipped->setFirstSkipped(c);
    // Number of code points read since the last match (at this point: c and nextCp).
    int32_t sinceMatch = 2;
    c = nextCp;
    for(;;) {
        UStringTrieResult match;
        // "If C is not blocked from S, find if S + C has a match in the table." (S2.1.2)
        if(prevCC < (fcd16 >> 8) && USTRINGTRIE_HAS_VALUE(match = suffixes.nextForCodePoint(c))) {
            // "If there is a match, replace S by S + C, and remove C." (S2.1.3)
            // Keep prevCC unchanged.
            ce32 = (uint32_t)suffixes.getValue();
            sinceMatch = 0;
            skipped->recordMatch();
            if(!USTRINGTRIE_HAS_NEXT(match)) { break; }
            skipped->saveTrieState(suffixes);
        } else {
            // No match for "S + C", skip C.
            skipped->skip(c);
            skipped->resetToTrieState(suffixes);
            prevCC = (uint8_t)fcd16;
        }
        if((c = nextSkippedCodePoint(errorCode)) < 0) { break; }
        ++sinceMatch;
        fcd16 = d->getFCD16(c);
        if(fcd16 <= 0xff) {
            // The next code point after c is a starter (S2.1.1 "process each non-starter").
            break;
        }
    }
    backwardNumSkipped(sinceMatch, errorCode);
    UBool isTopDiscontiguous = skipped->isEmpty();
    skipped->replaceMatch();
    if(isTopDiscontiguous && !skipped->isEmpty()) {
        // We did get a match after skipping one or more combining marks,
        // and we are not in a recursive discontiguous contraction.
        // Append CEs from the contraction ce32
        // and then from the combining marks that we skipped before the match.
        c = U_SENTINEL;
        for(;;) {
            appendCEsFromCE32(d, c, ce32, TRUE, errorCode);
            // Fetch CE32s for skipped combining marks from the normal data, with fallback,
            // rather than from the CollationData where we found the contraction.
            if(!skipped->hasNext()) { break; }
            c = skipped->next();
            ce32 = getDataCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                d = data->base;
                ce32 = d->getCE32(c);
            } else {
                d = data;
            }
            // Note: A nested discontiguous-contraction match
            // replaces consumed combining marks with newly skipped ones
            // and resets the reading position to the beginning.
        }
        skipped->clear();
        ce32 = Collation::NO_CE32;  // Signal to the caller that the result is in the ceBuffer.
    }
    return ce32;
}